

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

void __thiscall
ot::commissioner::Interpreter::PrintNetworkMessage
          (Interpreter *this,string *alias,string *aMessage,Color aColor)

{
  string *aLine;
  string local_30;
  
  aLine = (string *)std::__cxx11::string::append((char *)alias);
  Console::Write(aLine,kDefault);
  Console::Write(aMessage,aColor);
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"\n","");
  Console::Write(&local_30,kDefault);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Interpreter::PrintNetworkMessage(std::string alias, std::string aMessage, Console::Color aColor)
{
    Console::Write(alias.append(": "));
    Console::Write(aMessage, aColor);
    Console::Write("\n");
}